

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_> __thiscall
Parser::parseVariableDeclaration(Parser *this)

{
  Mark MVar1;
  Mark *pMVar2;
  variant_alternative_t<0UL,_variant<basic_string<char>,_double>_> *pvVar3;
  Token *pTVar4;
  Tokenizer *in_RSI;
  allocator<char> local_a9;
  long *local_a8;
  TypeName type;
  undefined1 local_98 [32];
  Token token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  
  pMVar2 = Stream::getMark(&in_RSI->stream_);
  MVar1 = *pMVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&token,"Expected variable declaration!",(allocator<char> *)&name);
  expectToken((Parser *)in_RSI,KeywordLet,(string *)&token);
  std::__cxx11::string::~string((string *)&token);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"Expected variable name!",(allocator<char> *)&local_a8);
  getToken(&token,(Parser *)in_RSI,Identifier,(string *)local_98);
  pvVar3 = std::get<0ul,std::__cxx11::string,double>(&token.value);
  std::__cxx11::string::string((string *)&name,(string *)pvVar3);
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)&token.value);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&token,"Expected colon!",(allocator<char> *)local_98);
  expectToken((Parser *)in_RSI,Colon,(string *)&token);
  std::__cxx11::string::~string((string *)&token);
  type = parseType((Parser *)in_RSI);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&token,"Expected assigment operator!",(allocator<char> *)local_98);
  expectToken((Parser *)in_RSI,Assign,(string *)&token);
  std::__cxx11::string::~string((string *)&token);
  pTVar4 = Tokenizer::peek(in_RSI);
  Token::Token(&token,pTVar4);
  if (token.type == Backslash) {
    parseLambda((Parser *)local_98);
  }
  else {
    parseLogicalExpression((Parser *)local_98);
  }
  local_a8 = (long *)local_98._0_8_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"Expected semicolon!",&local_a9);
  expectToken((Parser *)in_RSI,Semicolon,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::
  make_unique<VariableDeclarationNode,std::__cxx11::string_const&,TypeName_const&,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (TypeName *)&name,
             (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)&type);
  *(Mark *)((this->tokenizer_).stream_.is_ + 8) = MVar1;
  if (local_a8 != (long *)0x0) {
    (**(code **)(*local_a8 + 8))();
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)&token.value);
  std::__cxx11::string::~string((string *)&name);
  return (__uniq_ptr_data<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>,_true,_true>
          )(__uniq_ptr_data<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VariableDeclarationNode> Parser::parseVariableDeclaration()
{
  const auto mark = tokenizer_.getMark();
  expectToken(TokenType::KeywordLet, "Expected variable declaration!");
  const auto name = std::get<std::string>(getToken(TokenType::Identifier, "Expected variable name!").value);
  expectToken(TokenType::Colon, "Expected colon!");
  const auto type = parseType();
  expectToken(TokenType::Assign, "Expected assigment operator!");

  const auto token = tokenizer_.peek();
  std::unique_ptr<ExpressionNode> value = nullptr;
  if(token.type == TokenType::Backslash)
    value = parseLambda();
  else
    value = parseLogicalExpression();

  expectToken(TokenType::Semicolon, "Expected semicolon!");
  auto node = std::make_unique<VariableDeclarationNode>(name, type, std::move(value));
  node->setMark(mark);
  return node;
}